

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t av1_lowbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  uint uVar1;
  int iVar2;
  int32_t e_3;
  int32_t e_2;
  int32_t v_2;
  int32_t u_2;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  int32_t e;
  int32_t v;
  int32_t u;
  int64_t err;
  uint8_t *dat;
  uint8_t *src;
  int j;
  int i;
  int dat_stride_local;
  uint8_t *dat8_local;
  int src_stride_local;
  int height_local;
  int width_local;
  uint8_t *src8_local;
  
  err = 0;
  dat = dat8;
  src = src8;
  if ((params->r[0] < 1) || (params->r[1] < 1)) {
    if (params->r[0] < 1) {
      if (params->r[1] < 1) {
        for (i = 0; i < height; i = i + 1) {
          for (j = 0; j < width; j = j + 1) {
            err = (long)(int)((uint)dat[j] - (uint)src[j]) *
                  (long)(int)((uint)dat[j] - (uint)src[j]) + err;
          }
          dat = dat + dat_stride;
          src = src + src_stride;
        }
      }
      else {
        for (i = 0; i < height; i = i + 1) {
          for (j = 0; j < width; j = j + 1) {
            iVar2 = ((int)(xq[1] * (flt1[j] + (uint)dat[j] * -0x10) + (uint)dat[j] * 0x800 + 0x400)
                    >> 0xb) - (uint)src[j];
            err = (long)iVar2 * (long)iVar2 + err;
          }
          dat = dat + dat_stride;
          src = src + src_stride;
          flt1 = flt1 + flt1_stride;
        }
      }
    }
    else {
      for (i = 0; i < height; i = i + 1) {
        for (j = 0; j < width; j = j + 1) {
          iVar2 = ((int)(*xq * (flt0[j] + (uint)dat[j] * -0x10) + (uint)dat[j] * 0x800 + 0x400) >>
                  0xb) - (uint)src[j];
          err = (long)iVar2 * (long)iVar2 + err;
        }
        dat = dat + dat_stride;
        src = src + src_stride;
        flt0 = flt0 + flt0_stride;
      }
    }
  }
  else {
    for (i = 0; i < height; i = i + 1) {
      for (j = 0; j < width; j = j + 1) {
        uVar1 = (uint)dat[j];
        iVar2 = ((int)(*xq * (flt0[j] + uVar1 * -0x10) + xq[1] * (flt1[j] + uVar1 * -0x10) +
                       uVar1 * 0x800 + 0x400) >> 0xb) - (uint)src[j];
        err = (long)iVar2 * (long)iVar2 + err;
      }
      dat = dat + dat_stride;
      src = src + src_stride;
      flt0 = flt0 + flt0_stride;
      flt1 = flt1 + flt1_stride;
    }
  }
  return err;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_c(const uint8_t *src8, int width, int height,
                                     int src_stride, const uint8_t *dat8,
                                     int dat_stride, int32_t *flt0,
                                     int flt0_stride, int32_t *flt1,
                                     int flt1_stride, int xq[2],
                                     const sgr_params_type *params) {
  int i, j;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u) + xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
    }
  } else if (params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt1 += flt1_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t e = (int32_t)(dat[j]) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  return err;
}